

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O2

void __thiscall Assimp::IFC::Schema_2x3::IfcBSplineCurve::~IfcBSplineCurve(IfcBSplineCurve *this)

{
  ~IfcBSplineCurve((IfcBSplineCurve *)((long)&this[-1].CurveForm.field_2 + 8));
  return;
}

Assistant:

IfcBSplineCurve() : Object("IfcBSplineCurve") {}